

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_simulation_helpers.hpp
# Opt level: O3

RateAdaptiveCode<unsigned_int> * __thiscall
LDPC4QKD::CodeSimulationHelpers::load_ldpc_from_cscmat<bool,unsigned_int>
          (RateAdaptiveCode<unsigned_int> *__return_storage_ptr__,CodeSimulationHelpers *this,
          string *cscmat_file_path,string *rate_adaption_file_path)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> row_idx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> colptr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> rows_to_combine;
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  pair;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_48;
  
  read_matrix_from_cscmat<unsigned_int,unsigned_int>(&local_48,(LDPC4QKD *)this,cscmat_file_path);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_c0,&local_48.first);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_d8,&local_48.second);
  if (cscmat_file_path->_M_string_length == 0) {
    RateAdaptiveCode<unsigned_int>::RateAdaptiveCode<unsigned_int>
              (__return_storage_ptr__,&local_c0,&local_d8);
  }
  else {
    read_rate_adaption_from_csv<unsigned_int>(&local_60,cscmat_file_path);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_78,&local_c0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_90,&local_d8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_a8,&local_60);
    RateAdaptiveCode<unsigned_int>::RateAdaptiveCode<unsigned_int>
              (__return_storage_ptr__,&local_78,&local_90,&local_a8,0);
    if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.second.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.second.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_48.first.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.first.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.first.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.first.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

LDPC4QKD::RateAdaptiveCode< idx_t> load_ldpc_from_cscmat(
            const std::string &cscmat_file_path, const std::string &rate_adaption_file_path=""
    ) {
        auto pair = LDPC4QKD::read_matrix_from_cscmat<idx_t>(cscmat_file_path);
        auto colptr = pair.first;
        auto row_idx = pair.second;

        if(rate_adaption_file_path.empty()) {
            return LDPC4QKD::RateAdaptiveCode<idx_t>(colptr, row_idx);
        } else {
            std::vector<idx_t> rows_to_combine = read_rate_adaption_from_csv<idx_t>(rate_adaption_file_path);
            return LDPC4QKD::RateAdaptiveCode<idx_t>(colptr, row_idx, rows_to_combine);
        }
    }